

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all.hpp
# Opt level: O0

timer_object_holder<timertt::thread_safety::unsafe> __thiscall
timertt::details::
timer_list_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
::allocate(timer_list_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
           *this)

{
  timer_type *this_00;
  timer_list_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
  *this_local;
  
  this_00 = (timer_type *)operator_new(0x50);
  timer_type::timer_type(this_00);
  timer_object_holder<timertt::thread_safety::unsafe>::timer_object_holder
            ((timer_object_holder<timertt::thread_safety::unsafe> *)this,
             (timer_object<timertt::thread_safety::unsafe> *)this_00);
  return (timer_object_holder<timertt::thread_safety::unsafe>)
         (timer_object<timertt::thread_safety::unsafe> *)this;
}

Assistant:

timer_object_holder< THREAD_SAFETY >
	allocate()
	{
		return timer_object_holder< THREAD_SAFETY >( new timer_type() );
	}